

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O3

string * __thiscall
libcellml::XmlDoc::prettyPrint_abi_cxx11_(string *__return_storage_ptr__,XmlDoc *this)

{
  char *pcVar1;
  size_t sVar2;
  xmlChar *buffer;
  int size;
  stringstream res;
  char *local_1b0;
  undefined4 local_1a4;
  stringstream local_1a0 [16];
  long local_190 [14];
  ios_base local_120 [264];
  
  local_1a4 = 0;
  xmlDocDumpFormatMemoryEnc(this->mPimpl->mXmlDocPtr,&local_1b0,&local_1a4,"UTF-8",1);
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = local_1b0;
  if (local_1b0 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  }
  else {
    sVar2 = strlen(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar2);
  }
  (*_xmlFree)(local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlDoc::prettyPrint() const
{
    xmlChar *buffer;
    int size = 0;
    xmlDocDumpFormatMemoryEnc(mPimpl->mXmlDocPtr, &buffer, &size, "UTF-8", 1);
    std::stringstream res;
    res << buffer;
    xmlFree(buffer);
    return res.str();
}